

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAbstractButtonListModel.cpp
# Opt level: O2

bool __thiscall
QAbstractButtonListModel::removeRows
          (QAbstractButtonListModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (((-1 < row && 0 < count) &&
      (iVar2 = (**(code **)(*(long *)this + 0x78))(this,parent), count + row <= iVar2)) &&
     (bVar1 = QModelIndex::isValid(parent), !bVar1)) {
    local_40 = 0xffffffffffffffff;
    local_38 = 0;
    uStack_30 = 0;
    QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_40,row);
    QList<QMap<int,_QVariant>_>::remove(&this->d->buttons,(char *)(ulong)(uint)row);
    QAbstractItemModel::endRemoveRows();
    return true;
  }
  return false;
}

Assistant:

bool QAbstractButtonListModel::removeRows(int row, int count, const QModelIndex &parent) {
    if (count < 1 || row < 0 || (row + count) > rowCount(parent) || parent.isValid()) {
        return false;
    }

    beginRemoveRows(QModelIndex(), row, row + count - 1);
    d->buttons.remove(row, count);
    endRemoveRows();

    return true;
}